

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellReissner4::ComputeInternalJacobians
          (ChElementShellReissner4 *this,double Kfactor,double Rfactor)

{
  long *plVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  long lVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined1 auVar28 [64];
  long lVar29;
  long lVar30;
  pointer pLVar31;
  ulong uVar32;
  LhsNested a_rhs;
  ChMatrixNM<double,_12,_24> *pCVar33;
  ChMatrixNM<double,_12,_IDOFS> *a_rhs_00;
  ChVector<double> *pCVar34;
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  ChMatrixNM<double,_12,_12> C;
  ChMatrixNM<double,_12,_12> l_C;
  ChMatrixNM<double,_24,_24> Rm;
  ChMatrixNM<double,_24,_24> Km;
  ChMatrixNM<double,_24,_24> Kg;
  mul_assign_op<double,_double> local_5261;
  plainobjectbase_evaluator_data<double,_24> local_5260;
  Product<Eigen::Transpose<Eigen::Matrix<double,_12,_24,_1,_12,_24>_>,_Eigen::Matrix<double,_12,_12,_1,_12,_12>,_0>
  local_5258;
  ChMatrixNM<double,_12,_24> *local_5248;
  ChMatrixNM<double,_12,_24> *local_5240;
  long local_5238;
  double local_5230;
  ChVector<double> *local_5228;
  ChVector<double> *local_5220;
  ChVector<double> *local_5218;
  ChVector<double> *local_5210;
  double local_5208;
  ChMatrixNM<double,_12,_IDOFS> *local_5200;
  ChMatrixNM<double,_12,_24> *local_51f8;
  ChMatrixNM<double,_15,_15> *local_51f0;
  ChMatrixNM<double,_15,_24> *local_51e8;
  ChVector<double> *local_51e0;
  ChVector<double> *local_51d8;
  Scalar *local_51d0;
  undefined8 local_51c8;
  undefined8 local_51c0;
  undefined8 local_51b8;
  Scalar *local_51a8;
  undefined8 local_51a0;
  undefined8 local_5198;
  undefined8 local_5190;
  undefined1 local_5180 [128];
  undefined1 local_5100 [64];
  undefined1 local_50c0 [64];
  undefined1 local_5080 [64];
  undefined1 local_5040 [64];
  undefined1 local_5000 [64];
  undefined1 local_4fc0 [64];
  undefined1 local_4f80 [64];
  undefined1 local_4f40 [64];
  undefined1 local_4f00 [64];
  undefined1 local_4ec0 [64];
  undefined1 local_4e80 [64];
  undefined1 local_4e40 [64];
  undefined1 local_4e00 [64];
  undefined1 local_4dc0 [64];
  undefined1 local_4d80 [64];
  undefined1 local_4d40 [64];
  Scalar local_4d00;
  undefined1 auStack_4cf8 [56];
  undefined1 local_4cc0 [64];
  undefined1 local_4c80 [64];
  undefined1 local_4c40 [64];
  undefined1 local_4c00 [64];
  undefined1 local_4bc0 [64];
  undefined1 local_4b80 [64];
  undefined1 local_4b40 [64];
  undefined1 local_4b00 [64];
  undefined1 local_4ac0 [64];
  undefined1 local_4a80 [64];
  undefined1 local_4a40 [64];
  undefined1 local_4a00 [64];
  undefined1 local_49c0 [64];
  undefined1 local_4980 [64];
  undefined1 local_4940 [64];
  undefined1 local_4900 [64];
  undefined1 local_48c0 [64];
  Matrix<double,_24,_24,_1,_24,_24> local_4880;
  undefined1 local_3680 [128];
  undefined1 local_3600 [64];
  undefined1 local_35c0 [64];
  undefined1 local_3580 [64];
  undefined1 local_3540 [64];
  undefined1 local_3500 [64];
  undefined1 local_34c0 [64];
  undefined1 local_3480 [64];
  undefined1 local_3440 [64];
  undefined1 local_3400 [64];
  undefined1 local_33c0 [64];
  undefined1 local_3380 [64];
  undefined1 local_3340 [64];
  undefined8 auStack_2500 [16];
  undefined1 local_2480 [128];
  undefined1 local_2400 [64];
  undefined1 local_23c0 [64];
  undefined1 local_2380 [64];
  undefined1 local_2340 [64];
  undefined1 local_2300 [64];
  undefined1 local_22c0 [64];
  undefined1 local_2280 [64];
  undefined1 local_2240 [64];
  undefined1 local_2200 [64];
  undefined1 local_21c0 [64];
  undefined1 local_2180 [64];
  undefined1 local_2140 [64];
  undefined8 auStack_1300 [16];
  undefined1 local_1280 [128];
  undefined1 local_1200 [64];
  undefined1 local_11c0 [64];
  undefined1 local_1180 [64];
  undefined1 local_1140 [64];
  undefined1 local_1100 [64];
  undefined1 local_10c0 [64];
  undefined1 local_1080 [64];
  undefined1 local_1040 [64];
  undefined1 local_1000 [64];
  undefined1 local_fc0 [64];
  undefined1 local_f80 [64];
  undefined1 local_f40 [64];
  
  lVar29 = 0;
  local_5230 = Kfactor;
  local_5208 = Rfactor;
  memset(&this->m_JacobianMatrix,0,0x1200);
  local_51f0 = this->G_i;
  local_5210 = this->eps_tilde_1_i;
  local_51e8 = this->D_overline_i;
  local_5218 = this->eps_tilde_2_i;
  local_5220 = this->k_tilde_1_i;
  local_5228 = this->k_tilde_2_i;
  local_51f8 = this->B_overline_i;
  local_5200 = this->P_i;
  do {
    auVar35 = local_5180._0_64_;
    a_rhs.m_matrix = local_51e8 + lVar29;
    local_5180._8_8_ = local_51f0 + lVar29;
    local_5180._0_8_ = a_rhs.m_matrix;
    local_5180._24_40_ = auVar35._24_40_;
    local_5180._16_8_ = a_rhs.m_matrix;
    local_5238 = lVar29;
    memset(&local_4880,0,0x1200);
    local_4d00 = 1.0;
    Eigen::internal::
    generic_product_impl<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,15,24,1,15,24>>,Eigen::Matrix<double,15,15,1,15,15>,0>,Eigen::Matrix<double,15,24,1,15,24>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::scaleAndAddTo<Eigen::Matrix<double,24,24,1,24,24>>
              (&local_4880,
               (Product<Eigen::Transpose<Eigen::Matrix<double,_15,_24,_1,_15,_24>_>,_Eigen::Matrix<double,_15,_15,_1,_15,_15>,_0>
                *)local_5180,a_rhs.m_matrix,&local_4d00);
    lVar29 = 0x80;
    do {
      uVar5 = *(undefined8 *)(local_4900 + lVar29 + 8);
      uVar6 = *(undefined8 *)(local_4900 + lVar29 + 0x10);
      uVar7 = *(undefined8 *)(local_4900 + lVar29 + 0x18);
      uVar8 = *(undefined8 *)(local_4900 + lVar29 + 0x20);
      uVar9 = *(undefined8 *)(local_4900 + lVar29 + 0x28);
      uVar10 = *(undefined8 *)(local_4900 + lVar29 + 0x30);
      uVar11 = *(undefined8 *)(local_4900 + lVar29 + 0x38);
      uVar12 = *(undefined8 *)(local_48c0 + lVar29);
      uVar13 = *(undefined8 *)(local_48c0 + lVar29 + 8);
      uVar14 = *(undefined8 *)(local_48c0 + lVar29 + 0x10);
      uVar15 = *(undefined8 *)(local_48c0 + lVar29 + 0x18);
      uVar16 = *(undefined8 *)(local_48c0 + lVar29 + 0x20);
      uVar17 = *(undefined8 *)(local_48c0 + lVar29 + 0x28);
      uVar18 = *(undefined8 *)(local_48c0 + lVar29 + 0x30);
      uVar19 = *(undefined8 *)(local_48c0 + lVar29 + 0x38);
      uVar20 = *(undefined8 *)
                ((long)local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                       m_storage.m_data.array + lVar29);
      uVar21 = *(undefined8 *)
                ((long)local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                       m_storage.m_data.array + lVar29 + 8);
      uVar22 = *(undefined8 *)
                ((long)local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                       m_storage.m_data.array + lVar29 + 0x10);
      uVar23 = *(undefined8 *)
                ((long)local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                       m_storage.m_data.array + lVar29 + 0x18);
      uVar24 = *(undefined8 *)
                ((long)local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                       m_storage.m_data.array + lVar29 + 0x20);
      uVar25 = *(undefined8 *)
                ((long)local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                       m_storage.m_data.array + lVar29 + 0x28);
      uVar26 = *(undefined8 *)
                ((long)local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                       m_storage.m_data.array + lVar29 + 0x30);
      uVar27 = *(undefined8 *)
                ((long)local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                       m_storage.m_data.array + lVar29 + 0x38);
      *(undefined8 *)((long)auStack_1300 + lVar29) = *(undefined8 *)(local_4900 + lVar29);
      *(undefined8 *)((long)auStack_1300 + lVar29 + 8) = uVar5;
      *(undefined8 *)((long)auStack_1300 + lVar29 + 0x10) = uVar6;
      *(undefined8 *)((long)auStack_1300 + lVar29 + 0x18) = uVar7;
      *(undefined8 *)((long)auStack_1300 + lVar29 + 0x20) = uVar8;
      *(undefined8 *)((long)auStack_1300 + lVar29 + 0x28) = uVar9;
      *(undefined8 *)((long)auStack_1300 + lVar29 + 0x30) = uVar10;
      *(undefined8 *)((long)auStack_1300 + lVar29 + 0x38) = uVar11;
      *(undefined8 *)((long)auStack_1300 + lVar29 + 0x40) = uVar12;
      *(undefined8 *)((long)auStack_1300 + lVar29 + 0x48) = uVar13;
      *(undefined8 *)((long)auStack_1300 + lVar29 + 0x50) = uVar14;
      *(undefined8 *)((long)auStack_1300 + lVar29 + 0x58) = uVar15;
      *(undefined8 *)((long)auStack_1300 + lVar29 + 0x60) = uVar16;
      *(undefined8 *)((long)auStack_1300 + lVar29 + 0x68) = uVar17;
      *(undefined8 *)((long)auStack_1300 + lVar29 + 0x70) = uVar18;
      *(undefined8 *)((long)auStack_1300 + lVar29 + 0x78) = uVar19;
      *(undefined8 *)(local_1280 + lVar29) = uVar20;
      *(undefined8 *)(local_1280 + lVar29 + 8) = uVar21;
      *(undefined8 *)(local_1280 + lVar29 + 0x10) = uVar22;
      *(undefined8 *)(local_1280 + lVar29 + 0x18) = uVar23;
      *(undefined8 *)(local_1280 + lVar29 + 0x20) = uVar24;
      *(undefined8 *)(local_1280 + lVar29 + 0x28) = uVar25;
      *(undefined8 *)(local_1280 + lVar29 + 0x30) = uVar26;
      *(undefined8 *)(local_1280 + lVar29 + 0x38) = uVar27;
      lVar29 = lVar29 + 0xc0;
    } while (lVar29 != 0x1280);
    memset(local_5180,0,0x480);
    memset(&local_4d00,0,0x480);
    pLVar31 = (this->m_layers).
              super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_layers).
        super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
        ._M_impl.super__Vector_impl_data._M_finish != pLVar31) {
      lVar29 = 0;
      uVar32 = 0;
      local_5240 = (ChMatrixNM<double,_12,_24> *)(local_5210 + local_5238);
      local_51d8 = local_5218 + local_5238;
      local_51e0 = local_5220 + local_5238;
      pCVar34 = local_5228 + local_5238;
      do {
        plVar1 = *(long **)((long)&(pLVar31->m_material).
                                   super___shared_ptr<chrono::fea::ChMaterialShellReissner,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr + lVar29);
        p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  ((long)&(pLVar31->m_material).
                          super___shared_ptr<chrono::fea::ChMaterialShellReissner,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi + lVar29);
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          }
        }
        local_51a8 = &local_4d00;
        local_51a0 = 0xc;
        local_5198 = 0xc;
        local_5190 = 0xc;
        (**(code **)(*plVar1 + 0x18))(plVar1,&local_51a8,local_5240,local_51d8,local_51e0,pCVar34,0)
        ;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        }
        auVar35._8_56_ = auStack_4cf8;
        auVar35._0_8_ = local_4d00;
        uVar32 = uVar32 + 1;
        lVar29 = lVar29 + 0x28;
        local_5180._0_64_ = vaddpd_avx512f(auVar35,local_5180._0_64_);
        local_5180._64_64_ = vaddpd_avx512f(local_4cc0,local_5180._64_64_);
        local_5100 = vaddpd_avx512f(local_4c80,local_5100);
        local_50c0 = vaddpd_avx512f(local_4c40,local_50c0);
        local_5080 = vaddpd_avx512f(local_4c00,local_5080);
        local_5040 = vaddpd_avx512f(local_4bc0,local_5040);
        local_5000 = vaddpd_avx512f(local_4b80,local_5000);
        local_4fc0 = vaddpd_avx512f(local_4b40,local_4fc0);
        local_4f80 = vaddpd_avx512f(local_4b00,local_4f80);
        local_4f40 = vaddpd_avx512f(local_4ac0,local_4f40);
        local_4f00 = vaddpd_avx512f(local_4a80,local_4f00);
        local_4ec0 = vaddpd_avx512f(local_4a40,local_4ec0);
        local_4e80 = vaddpd_avx512f(local_4a00,local_4e80);
        local_4e40 = vaddpd_avx512f(local_49c0,local_4e40);
        local_4e00 = vaddpd_avx512f(local_4980,local_4e00);
        local_4dc0 = vaddpd_avx512f(local_4940,local_4dc0);
        local_4d80 = vaddpd_avx512f(local_4900,local_4d80);
        local_4d40 = vaddpd_avx512f(local_48c0,local_4d40);
        pLVar31 = (this->m_layers).
                  super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar32 < (ulong)(((long)(this->m_layers).
                                       super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar31 >>
                                3) * -0x3333333333333333));
    }
    lVar29 = local_5238;
    local_5258.m_rhs = (RhsNested)local_5180;
    pCVar33 = local_51f8 + local_5238;
    local_5258.m_lhs.m_matrix = pCVar33;
    local_5248 = pCVar33;
    memset(&local_4880,0,0x1200);
    local_5260.data = (double *)0x3ff0000000000000;
    local_5240 = pCVar33;
    Eigen::internal::
    generic_product_impl<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,12,24,1,12,24>>,Eigen::Matrix<double,12,12,1,12,12>,0>,Eigen::Matrix<double,12,24,1,12,24>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::scaleAndAddTo<Eigen::Matrix<double,24,24,1,24,24>>
              (&local_4880,&local_5258,pCVar33,(Scalar *)&local_5260);
    pCVar33 = local_5240;
    lVar30 = 0x80;
    do {
      uVar5 = *(undefined8 *)(local_4900 + lVar30 + 8);
      uVar6 = *(undefined8 *)(local_4900 + lVar30 + 0x10);
      uVar7 = *(undefined8 *)(local_4900 + lVar30 + 0x18);
      uVar8 = *(undefined8 *)(local_4900 + lVar30 + 0x20);
      uVar9 = *(undefined8 *)(local_4900 + lVar30 + 0x28);
      uVar10 = *(undefined8 *)(local_4900 + lVar30 + 0x30);
      uVar11 = *(undefined8 *)(local_4900 + lVar30 + 0x38);
      uVar12 = *(undefined8 *)(local_48c0 + lVar30);
      uVar13 = *(undefined8 *)(local_48c0 + lVar30 + 8);
      uVar14 = *(undefined8 *)(local_48c0 + lVar30 + 0x10);
      uVar15 = *(undefined8 *)(local_48c0 + lVar30 + 0x18);
      uVar16 = *(undefined8 *)(local_48c0 + lVar30 + 0x20);
      uVar17 = *(undefined8 *)(local_48c0 + lVar30 + 0x28);
      uVar18 = *(undefined8 *)(local_48c0 + lVar30 + 0x30);
      uVar19 = *(undefined8 *)(local_48c0 + lVar30 + 0x38);
      uVar20 = *(undefined8 *)
                ((long)local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                       m_storage.m_data.array + lVar30);
      uVar21 = *(undefined8 *)
                ((long)local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                       m_storage.m_data.array + lVar30 + 8);
      uVar22 = *(undefined8 *)
                ((long)local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                       m_storage.m_data.array + lVar30 + 0x10);
      uVar23 = *(undefined8 *)
                ((long)local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                       m_storage.m_data.array + lVar30 + 0x18);
      uVar24 = *(undefined8 *)
                ((long)local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                       m_storage.m_data.array + lVar30 + 0x20);
      uVar25 = *(undefined8 *)
                ((long)local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                       m_storage.m_data.array + lVar30 + 0x28);
      uVar26 = *(undefined8 *)
                ((long)local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                       m_storage.m_data.array + lVar30 + 0x30);
      uVar27 = *(undefined8 *)
                ((long)local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                       m_storage.m_data.array + lVar30 + 0x38);
      *(undefined8 *)((long)auStack_2500 + lVar30) = *(undefined8 *)(local_4900 + lVar30);
      *(undefined8 *)((long)auStack_2500 + lVar30 + 8) = uVar5;
      *(undefined8 *)((long)auStack_2500 + lVar30 + 0x10) = uVar6;
      *(undefined8 *)((long)auStack_2500 + lVar30 + 0x18) = uVar7;
      *(undefined8 *)((long)auStack_2500 + lVar30 + 0x20) = uVar8;
      *(undefined8 *)((long)auStack_2500 + lVar30 + 0x28) = uVar9;
      *(undefined8 *)((long)auStack_2500 + lVar30 + 0x30) = uVar10;
      *(undefined8 *)((long)auStack_2500 + lVar30 + 0x38) = uVar11;
      *(undefined8 *)((long)auStack_2500 + lVar30 + 0x40) = uVar12;
      *(undefined8 *)((long)auStack_2500 + lVar30 + 0x48) = uVar13;
      *(undefined8 *)((long)auStack_2500 + lVar30 + 0x50) = uVar14;
      *(undefined8 *)((long)auStack_2500 + lVar30 + 0x58) = uVar15;
      *(undefined8 *)((long)auStack_2500 + lVar30 + 0x60) = uVar16;
      *(undefined8 *)((long)auStack_2500 + lVar30 + 0x68) = uVar17;
      *(undefined8 *)((long)auStack_2500 + lVar30 + 0x70) = uVar18;
      *(undefined8 *)((long)auStack_2500 + lVar30 + 0x78) = uVar19;
      *(undefined8 *)(local_2480 + lVar30) = uVar20;
      *(undefined8 *)(local_2480 + lVar30 + 8) = uVar21;
      *(undefined8 *)(local_2480 + lVar30 + 0x10) = uVar22;
      *(undefined8 *)(local_2480 + lVar30 + 0x18) = uVar23;
      *(undefined8 *)(local_2480 + lVar30 + 0x20) = uVar24;
      *(undefined8 *)(local_2480 + lVar30 + 0x28) = uVar25;
      *(undefined8 *)(local_2480 + lVar30 + 0x30) = uVar26;
      *(undefined8 *)(local_2480 + lVar30 + 0x38) = uVar27;
      lVar30 = lVar30 + 0xc0;
    } while (lVar30 != 0x1280);
    a_rhs_00 = local_5200 + lVar29;
    local_5258.m_rhs = (RhsNested)local_5180;
    local_5248 = local_5240;
    local_5258.m_lhs.m_matrix = (non_const_type)a_rhs_00;
    memset(&local_4880,0,0x540);
    local_5260.data = (double *)0x3ff0000000000000;
    Eigen::internal::
    generic_product_impl<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,12,7,1,12,7>>,Eigen::Matrix<double,12,12,1,12,12>,0>,Eigen::Matrix<double,12,24,1,12,24>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::scaleAndAddTo<Eigen::Matrix<double,7,24,1,7,24>>
              ((Matrix<double,_7,_24,_1,_7,_24> *)&local_4880,
               (Product<Eigen::Transpose<Eigen::Matrix<double,_12,_7,_1,_12,_7>_>,_Eigen::Matrix<double,_12,_12,_1,_12,_12>,_0>
                *)&local_5258,pCVar33,(Scalar *)&local_5260);
    local_5260.data = (double *)0x3ff0000000000000;
    local_5258.m_rhs = (RhsNested)local_5180;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[0x30] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[0x28] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[0x29] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[0x2a] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[0x2b] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[0x2c] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[0x2d] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[0x2e] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[0x2f] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[0x20] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[0x21] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[0x22] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[0x23] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[0x24] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[0x25] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[0x26] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[0x27] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[0x18] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[0x19] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[0x1a] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[0x1b] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[0x1c] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[0x1d] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[0x1e] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[0x1f] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[0x10] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[0x11] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[0x12] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[0x13] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[0x14] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[0x15] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[0x16] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[0x17] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[8] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[9] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[10] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[0xb] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[0xc] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[0xd] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[0xe] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[0xf] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[0] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[1] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[2] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[3] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[4] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[5] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[6] = 0.0;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[7] = 0.0;
    local_5258.m_lhs.m_matrix = (non_const_type)a_rhs_00;
    local_5248 = (ChMatrixNM<double,_12,_24> *)a_rhs_00;
    Eigen::internal::
    generic_product_impl<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,12,7,1,12,7>>,Eigen::Matrix<double,12,12,1,12,12>,0>,Eigen::Matrix<double,12,7,1,12,7>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::scaleAndAddTo<Eigen::Matrix<double,7,7,1,7,7>>
              ((Matrix<double,_7,_7,_1,_7,_7> *)&local_4880,
               (Product<Eigen::Transpose<Eigen::Matrix<double,_12,_7,_1,_12,_7>_>,_Eigen::Matrix<double,_12,_12,_1,_12,_12>,_0>
                *)&local_5258,a_rhs_00,(Scalar *)&local_5260);
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[2] = (double)&local_5261;
    local_5260.data = (double *)local_2480;
    local_5258.m_lhs.m_matrix =
         (non_const_type)(this->alpha_i[lVar29] * (double)(&w_i)[lVar29] * local_5230);
    auVar36._8_8_ = 0;
    auVar36._0_8_ = local_5258.m_lhs.m_matrix;
    auVar35 = vbroadcastsd_avx512f(auVar36);
    local_2480._0_64_ = vmulpd_avx512f(auVar35,local_2480._0_64_);
    local_2480._64_64_ = vmulpd_avx512f(auVar35,local_2480._64_64_);
    local_2400 = vmulpd_avx512f(auVar35,local_2400);
    local_23c0 = vmulpd_avx512f(auVar35,local_23c0);
    local_2380 = vmulpd_avx512f(auVar35,local_2380);
    local_2340 = vmulpd_avx512f(auVar35,local_2340);
    local_2300 = vmulpd_avx512f(auVar35,local_2300);
    local_22c0 = vmulpd_avx512f(auVar35,local_22c0);
    local_2280 = vmulpd_avx512f(auVar35,local_2280);
    local_2240 = vmulpd_avx512f(auVar35,local_2240);
    local_2200 = vmulpd_avx512f(auVar35,local_2200);
    local_21c0 = vmulpd_avx512f(auVar35,local_21c0);
    local_2180 = vmulpd_avx512f(auVar35,local_2180);
    local_2140 = vmulpd_avx512f(auVar35,local_2140);
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[0] = (double)&local_5260;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[1] = (double)&local_5258;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[3] = (double)local_5260.data;
    Eigen::internal::
    copy_using_evaluator_innervec_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>,_112,_576>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>
           *)&local_4880);
    lVar30 = 0;
    do {
      auVar35 = vaddpd_avx512f(*(undefined1 (*) [64])(local_2480 + lVar30),
                               *(undefined1 (*) [64])
                                ((long)(this->m_JacobianMatrix).
                                       super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                       .m_storage.m_data.array + lVar30));
      *(undefined1 (*) [64])
       ((long)(this->m_JacobianMatrix).
              super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
              array + lVar30) = auVar35;
      auVar35 = vaddpd_avx512f(*(undefined1 (*) [64])(local_2480 + lVar30 + 0x40),
                               *(undefined1 (*) [64])
                                ((long)(this->m_JacobianMatrix).
                                       super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                       .m_storage.m_data.array + lVar30 + 0x40));
      *(undefined1 (*) [64])
       ((long)(this->m_JacobianMatrix).
              super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
              array + lVar30 + 0x40) = auVar35;
      auVar35 = vaddpd_avx512f(*(undefined1 (*) [64])(local_2400 + lVar30),
                               *(undefined1 (*) [64])
                                ((long)(this->m_JacobianMatrix).
                                       super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                       .m_storage.m_data.array + lVar30 + 0x80));
      *(undefined1 (*) [64])
       ((long)(this->m_JacobianMatrix).
              super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
              array + lVar30 + 0x80) = auVar35;
      lVar30 = lVar30 + 0xc0;
    } while (lVar30 != 0x1200);
    local_5260.data = (double *)local_1280;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[0] = (double)&local_5260;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[1] = (double)&local_5258;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[2] = (double)&local_5261;
    local_5258.m_lhs.m_matrix =
         (non_const_type)(this->alpha_i[lVar29] * (double)(&w_i)[lVar29] * local_5230);
    auVar37._8_8_ = 0;
    auVar37._0_8_ = local_5258.m_lhs.m_matrix;
    auVar35 = vbroadcastsd_avx512f(auVar37);
    local_1280._0_64_ = vmulpd_avx512f(auVar35,local_1280._0_64_);
    local_1280._64_64_ = vmulpd_avx512f(auVar35,local_1280._64_64_);
    local_1200 = vmulpd_avx512f(auVar35,local_1200);
    local_11c0 = vmulpd_avx512f(auVar35,local_11c0);
    local_1180 = vmulpd_avx512f(auVar35,local_1180);
    local_1140 = vmulpd_avx512f(auVar35,local_1140);
    local_1100 = vmulpd_avx512f(auVar35,local_1100);
    local_10c0 = vmulpd_avx512f(auVar35,local_10c0);
    local_1080 = vmulpd_avx512f(auVar35,local_1080);
    local_1040 = vmulpd_avx512f(auVar35,local_1040);
    local_1000 = vmulpd_avx512f(auVar35,local_1000);
    local_fc0 = vmulpd_avx512f(auVar35,local_fc0);
    local_f80 = vmulpd_avx512f(auVar35,local_f80);
    local_f40 = vmulpd_avx512f(auVar35,local_f40);
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[3] = (double)local_5260.data;
    Eigen::internal::
    copy_using_evaluator_innervec_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>,_112,_576>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>
           *)&local_4880);
    lVar29 = 0;
    do {
      auVar35 = vaddpd_avx512f(*(undefined1 (*) [64])(local_1280 + lVar29),
                               *(undefined1 (*) [64])
                                ((long)(this->m_JacobianMatrix).
                                       super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                       .m_storage.m_data.array + lVar29));
      *(undefined1 (*) [64])
       ((long)(this->m_JacobianMatrix).
              super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
              array + lVar29) = auVar35;
      auVar35 = vaddpd_avx512f(*(undefined1 (*) [64])(local_1280 + lVar29 + 0x40),
                               *(undefined1 (*) [64])
                                ((long)(this->m_JacobianMatrix).
                                       super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                       .m_storage.m_data.array + lVar29 + 0x40));
      *(undefined1 (*) [64])
       ((long)(this->m_JacobianMatrix).
              super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
              array + lVar29 + 0x40) = auVar35;
      auVar35 = vaddpd_avx512f(*(undefined1 (*) [64])(local_1200 + lVar29),
                               *(undefined1 (*) [64])
                                ((long)(this->m_JacobianMatrix).
                                       super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                       .m_storage.m_data.array + lVar29 + 0x80));
      *(undefined1 (*) [64])
       ((long)(this->m_JacobianMatrix).
              super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
              array + lVar29 + 0x80) = auVar35;
      lVar29 = lVar29 + 0xc0;
    } while (lVar29 != 0x1200);
    memset(local_5180,0,0x480);
    memset(&local_4d00,0,0x480);
    pLVar31 = (this->m_layers).
              super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_layers).
        super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
        ._M_impl.super__Vector_impl_data._M_finish != pLVar31) {
      lVar29 = 0;
      uVar32 = 0;
      do {
        lVar30 = *(long *)((long)&(pLVar31->m_material).
                                  super___shared_ptr<chrono::fea::ChMaterialShellReissner,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + lVar29);
        p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  ((long)&(pLVar31->m_material).
                          super___shared_ptr<chrono::fea::ChMaterialShellReissner,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi + lVar29);
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          }
        }
        lVar3 = *(long *)(lVar30 + 0x28);
        p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar30 + 0x30);
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
        }
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        }
        pLVar31 = (this->m_layers).
                  super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (lVar3 != 0) {
          lVar30 = *(long *)((long)&(pLVar31->m_material).
                                    super___shared_ptr<chrono::fea::ChMaterialShellReissner,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + lVar29);
          p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                    ((long)&(pLVar31->m_material).
                            super___shared_ptr<chrono::fea::ChMaterialShellReissner,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi + lVar29);
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            }
          }
          plVar1 = *(long **)(lVar30 + 0x28);
          p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar30 + 0x30);
          if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
            }
          }
          local_51d0 = &local_4d00;
          local_51c8 = 0xc;
          local_51c0 = 0xc;
          local_51b8 = 0xc;
          (**(code **)(*plVar1 + 0x18))(plVar1,&local_51d0,&VNULL,&VNULL,&VNULL,&VNULL);
          if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
          }
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          }
          auVar28._8_56_ = auStack_4cf8;
          auVar28._0_8_ = local_4d00;
          local_5180._0_64_ = vaddpd_avx512f(auVar28,local_5180._0_64_);
          local_5180._64_64_ = vaddpd_avx512f(local_4cc0,local_5180._64_64_);
          local_5100 = vaddpd_avx512f(local_4c80,local_5100);
          local_50c0 = vaddpd_avx512f(local_4c40,local_50c0);
          local_5080 = vaddpd_avx512f(local_4c00,local_5080);
          local_5040 = vaddpd_avx512f(local_4bc0,local_5040);
          local_5000 = vaddpd_avx512f(local_4b80,local_5000);
          local_4fc0 = vaddpd_avx512f(local_4b40,local_4fc0);
          local_4f80 = vaddpd_avx512f(local_4b00,local_4f80);
          local_4f40 = vaddpd_avx512f(local_4ac0,local_4f40);
          local_4f00 = vaddpd_avx512f(local_4a80,local_4f00);
          local_4ec0 = vaddpd_avx512f(local_4a40,local_4ec0);
          local_4e80 = vaddpd_avx512f(local_4a00,local_4e80);
          local_4e40 = vaddpd_avx512f(local_49c0,local_4e40);
          local_4e00 = vaddpd_avx512f(local_4980,local_4e00);
          local_4dc0 = vaddpd_avx512f(local_4940,local_4dc0);
          local_4d80 = vaddpd_avx512f(local_4900,local_4d80);
          local_4d40 = vaddpd_avx512f(local_48c0,local_4d40);
          pLVar31 = (this->m_layers).
                    super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        uVar32 = uVar32 + 1;
        lVar29 = lVar29 + 0x28;
      } while (uVar32 < (ulong)(((long)(this->m_layers).
                                       super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar31 >>
                                3) * -0x3333333333333333));
    }
    pCVar33 = local_5240;
    local_5258.m_rhs = (RhsNested)local_5180;
    local_5258.m_lhs.m_matrix = local_5240;
    local_5248 = local_5240;
    memset((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>
            *)&local_4880,0,0x1200);
    local_5260.data = (double *)0x3ff0000000000000;
    Eigen::internal::
    generic_product_impl<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,12,24,1,12,24>>,Eigen::Matrix<double,12,12,1,12,12>,0>,Eigen::Matrix<double,12,24,1,12,24>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::scaleAndAddTo<Eigen::Matrix<double,24,24,1,24,24>>
              (&local_4880,&local_5258,pCVar33,(Scalar *)&local_5260);
    lVar29 = local_5238;
    lVar30 = 0x80;
    do {
      uVar5 = *(undefined8 *)(local_4900 + lVar30 + 8);
      uVar6 = *(undefined8 *)(local_4900 + lVar30 + 0x10);
      uVar7 = *(undefined8 *)(local_4900 + lVar30 + 0x18);
      uVar8 = *(undefined8 *)(local_4900 + lVar30 + 0x20);
      uVar9 = *(undefined8 *)(local_4900 + lVar30 + 0x28);
      uVar10 = *(undefined8 *)(local_4900 + lVar30 + 0x30);
      uVar11 = *(undefined8 *)(local_4900 + lVar30 + 0x38);
      uVar12 = *(undefined8 *)(local_48c0 + lVar30);
      uVar13 = *(undefined8 *)(local_48c0 + lVar30 + 8);
      uVar14 = *(undefined8 *)(local_48c0 + lVar30 + 0x10);
      uVar15 = *(undefined8 *)(local_48c0 + lVar30 + 0x18);
      uVar16 = *(undefined8 *)(local_48c0 + lVar30 + 0x20);
      uVar17 = *(undefined8 *)(local_48c0 + lVar30 + 0x28);
      uVar18 = *(undefined8 *)(local_48c0 + lVar30 + 0x30);
      uVar19 = *(undefined8 *)(local_48c0 + lVar30 + 0x38);
      uVar20 = *(undefined8 *)
                ((long)local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                       m_storage.m_data.array + lVar30);
      uVar21 = *(undefined8 *)
                ((long)local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                       m_storage.m_data.array + lVar30 + 8);
      uVar22 = *(undefined8 *)
                ((long)local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                       m_storage.m_data.array + lVar30 + 0x10);
      uVar23 = *(undefined8 *)
                ((long)local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                       m_storage.m_data.array + lVar30 + 0x18);
      uVar24 = *(undefined8 *)
                ((long)local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                       m_storage.m_data.array + lVar30 + 0x20);
      uVar25 = *(undefined8 *)
                ((long)local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                       m_storage.m_data.array + lVar30 + 0x28);
      uVar26 = *(undefined8 *)
                ((long)local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                       m_storage.m_data.array + lVar30 + 0x30);
      uVar27 = *(undefined8 *)
                ((long)local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                       m_storage.m_data.array + lVar30 + 0x38);
      *(undefined8 *)(local_3680 + lVar30 + -0x80) = *(undefined8 *)(local_4900 + lVar30);
      *(undefined8 *)(local_3680 + lVar30 + -0x78) = uVar5;
      *(undefined8 *)(local_3680 + lVar30 + -0x70) = uVar6;
      *(undefined8 *)(local_3680 + lVar30 + -0x68) = uVar7;
      *(undefined8 *)(local_3680 + lVar30 + -0x60) = uVar8;
      *(undefined8 *)(local_3680 + lVar30 + -0x58) = uVar9;
      *(undefined8 *)(local_3680 + lVar30 + -0x50) = uVar10;
      *(undefined8 *)(local_3680 + lVar30 + -0x48) = uVar11;
      *(undefined8 *)(local_3680 + lVar30 + -0x40) = uVar12;
      *(undefined8 *)(local_3680 + lVar30 + -0x38) = uVar13;
      *(undefined8 *)(local_3680 + lVar30 + -0x30) = uVar14;
      *(undefined8 *)(local_3680 + lVar30 + -0x28) = uVar15;
      *(undefined8 *)(local_3680 + lVar30 + -0x20) = uVar16;
      *(undefined8 *)(local_3680 + lVar30 + -0x18) = uVar17;
      *(undefined8 *)(local_3680 + lVar30 + -0x10) = uVar18;
      *(undefined8 *)(local_3680 + lVar30 + -8) = uVar19;
      *(undefined8 *)(local_3680 + lVar30) = uVar20;
      *(undefined8 *)(local_3680 + lVar30 + 8) = uVar21;
      *(undefined8 *)(local_3680 + lVar30 + 0x10) = uVar22;
      *(undefined8 *)(local_3680 + lVar30 + 0x18) = uVar23;
      *(undefined8 *)(local_3680 + lVar30 + 0x20) = uVar24;
      *(undefined8 *)(local_3680 + lVar30 + 0x28) = uVar25;
      *(undefined8 *)(local_3680 + lVar30 + 0x30) = uVar26;
      *(undefined8 *)(local_3680 + lVar30 + 0x38) = uVar27;
      lVar30 = lVar30 + 0xc0;
    } while (lVar30 != 0x1280);
    local_5260.data = (double *)local_3680;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[0] = (double)&local_5260;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[1] = (double)&local_5258;
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[2] = (double)&local_5261;
    local_5258.m_lhs.m_matrix =
         (non_const_type)(this->alpha_i[local_5238] * (double)(&w_i)[local_5238] * local_5208);
    auVar38._8_8_ = 0;
    auVar38._0_8_ = local_5258.m_lhs.m_matrix;
    auVar35 = vbroadcastsd_avx512f(auVar38);
    local_3680._0_64_ = vmulpd_avx512f(auVar35,local_3680._0_64_);
    local_3680._64_64_ = vmulpd_avx512f(auVar35,local_3680._64_64_);
    local_3600 = vmulpd_avx512f(auVar35,local_3600);
    local_35c0 = vmulpd_avx512f(auVar35,local_35c0);
    local_3580 = vmulpd_avx512f(auVar35,local_3580);
    local_3540 = vmulpd_avx512f(auVar35,local_3540);
    local_3500 = vmulpd_avx512f(auVar35,local_3500);
    local_34c0 = vmulpd_avx512f(auVar35,local_34c0);
    local_3480 = vmulpd_avx512f(auVar35,local_3480);
    local_3440 = vmulpd_avx512f(auVar35,local_3440);
    local_3400 = vmulpd_avx512f(auVar35,local_3400);
    local_33c0 = vmulpd_avx512f(auVar35,local_33c0);
    local_3380 = vmulpd_avx512f(auVar35,local_3380);
    local_3340 = vmulpd_avx512f(auVar35,local_3340);
    local_4880.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
    array[3] = (double)local_5260.data;
    Eigen::internal::
    copy_using_evaluator_innervec_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>,_112,_576>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>
           *)&local_4880);
    lVar30 = 0;
    do {
      auVar35 = vaddpd_avx512f(*(undefined1 (*) [64])(local_3680 + lVar30),
                               *(undefined1 (*) [64])
                                ((long)(this->m_JacobianMatrix).
                                       super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                       .m_storage.m_data.array + lVar30));
      *(undefined1 (*) [64])
       ((long)(this->m_JacobianMatrix).
              super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
              array + lVar30) = auVar35;
      auVar35 = vaddpd_avx512f(*(undefined1 (*) [64])(local_3680 + lVar30 + 0x40),
                               *(undefined1 (*) [64])
                                ((long)(this->m_JacobianMatrix).
                                       super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                       .m_storage.m_data.array + lVar30 + 0x40));
      *(undefined1 (*) [64])
       ((long)(this->m_JacobianMatrix).
              super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
              array + lVar30 + 0x40) = auVar35;
      auVar35 = vaddpd_avx512f(*(undefined1 (*) [64])(local_3600 + lVar30),
                               *(undefined1 (*) [64])
                                ((long)(this->m_JacobianMatrix).
                                       super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                       .m_storage.m_data.array + lVar30 + 0x80));
      *(undefined1 (*) [64])
       ((long)(this->m_JacobianMatrix).
              super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
              array + lVar30 + 0x80) = auVar35;
      lVar30 = lVar30 + 0xc0;
    } while (lVar30 != 0x1200);
    lVar29 = lVar29 + 1;
  } while (lVar29 != 4);
  return;
}

Assistant:

void ChElementShellReissner4::ComputeInternalJacobians(double Kfactor, double Rfactor) {
    m_JacobianMatrix.setZero();

    // tangente

    ChMatrixNM<double, 24, 24> Kg;
    ChMatrixNM<double, 24, 24> Km;
	ChMatrixNM<double, 24, 24> Rm;
    ChMatrixNM<double, IDOFS, 24> K_beta_q;
    ChMatrixNM<double, IDOFS, IDOFS> K_beta_beta;

    for (int i = 0; i < NUMIP; i++) {
        // GEOMETRIC STIFFNESS Kg:

        Kg = D_overline_i[i].transpose() * G_i[i] * D_overline_i[i];

        // MATERIAL STIFFNESS Km:

        ChMatrixNM<double, 12, 12> C;
        ChMatrixNM<double, 12, 12> l_C;
        C.setZero();
        l_C.setZero();
        // loop on layers
        for (size_t il = 0; il < m_layers.size(); ++il) {
            // compute layer tang. material stiff, and accumulate
            m_layers[il].GetMaterial()->ComputeStiffnessMatrix(
                l_C, eps_tilde_1_i[i], eps_tilde_2_i[i], k_tilde_1_i[i], k_tilde_2_i[i], m_layers_z[il],
                m_layers_z[il + 1],
                m_layers[il].Get_theta());  // ***TODO*** use the total epsilon including the 'hat' component from EAS
            C += l_C;
        }

        Km = B_overline_i[i].transpose() * C * B_overline_i[i];

        // EAS STIFFNESS K_beta_q:
        K_beta_q = P_i[i].transpose() * C * B_overline_i[i];

        // EAS STIFFNESS K_beta_beta:
        K_beta_beta = P_i[i].transpose() * C * P_i[i];

        // Assembly the entire jacobian
        //  [ Km   Kbq' ]
        //  [ Kbq  Kbb  ]

        double dCoef = 1.0;  //***TODO*** autoset this

		Km *= (alpha_i[i] * w_i[i] * dCoef * Kfactor); // was: ... * dCoef * (Kfactor+Rfactor * m_Alpha));
        m_JacobianMatrix += Km;

#ifdef CHUSE_KGEOMETRIC
        Kg *= (alpha_i[i] * w_i[i] * dCoef * Kfactor);
        m_JacobianMatrix += Kg;
#endif

#ifdef CHUSE_EAS
        K_beta_q *= (alpha_i[i] * w_i[i] * Kfactor);
        K_beta_beta *= (alpha_i[i] * (w_i[i] / dCoef) * Kfactor);

        m_JacobianMatrix.block(24, 0, 7, 24) += K_beta_q;
        m_JacobianMatrix.block(0, 24, 24, 7) += K_beta_q.transpose();
        m_JacobianMatrix.block(24, 4, 7, 7) += K_beta_beta;
#endif

		// Damping matrix 

		C.setZero();
        l_C.setZero();
        // loop on layers
        for (size_t il = 0; il < m_layers.size(); ++il) {
            // compute layer damping matrix
			if (m_layers[il].GetMaterial()->GetDamping()) {
				m_layers[il].GetMaterial()->GetDamping()->ComputeDampingMatrix(
					l_C, 
					VNULL, VNULL, VNULL, VNULL, //***TODO*** should be more general: eps_dt_tilde_1_i[i], eps_dt_tilde_2_i[i], k_dt_tilde_1_i[i], k_dt_tilde_2_i[i], 
					m_layers_z[il],
					m_layers_z[il + 1],
					m_layers[il].Get_theta());  
				C += l_C;
			}
        }
		Rm = B_overline_i[i].transpose() * C * B_overline_i[i];
		Rm *= (alpha_i[i] * w_i[i] * dCoef * Rfactor);
        m_JacobianMatrix += Rm;
    }
}